

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O1

void UI::execute_volume_calculator(string *mesh_in)

{
  int iVar1;
  mesh_file in_mesh;
  string local_c8;
  string local_a8;
  mesh_file local_88;
  
  MSH::mesh_file::mesh_file(&local_88);
  iVar1 = MSH::mesh_file::import_meshfile(&local_88,mesh_in);
  if (iVar1 != 0) {
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"Error: Mesh Import failed.","");
    print_ln(&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  MSH::mesh_file::print_volumes(&local_88);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"Volume calculation ended.","");
  print_ln(&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  MSH::mesh_file::~mesh_file(&local_88);
  return;
}

Assistant:

void UI::execute_volume_calculator(const std::string &mesh_in)
{
    MSH::mesh_file in_mesh;
    if (in_mesh.import_meshfile(mesh_in)) print_ln("Error: Mesh Import failed.");
    in_mesh.print_volumes();
    print_ln("Volume calculation ended.");
}